

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint generateFixedLitLenTree(HuffmanTree *tree)

{
  uint *bitlen_00;
  uint *bitlen;
  uint error;
  uint i;
  HuffmanTree *tree_local;
  
  bitlen_00 = (uint *)lodepng_malloc(0x480);
  if (bitlen_00 == (uint *)0x0) {
    tree_local._4_4_ = 0x53;
  }
  else {
    for (bitlen._4_4_ = 0; bitlen._4_4_ < 0x90; bitlen._4_4_ = bitlen._4_4_ + 1) {
      bitlen_00[bitlen._4_4_] = 8;
    }
    for (bitlen._4_4_ = 0x90; bitlen._4_4_ < 0x100; bitlen._4_4_ = bitlen._4_4_ + 1) {
      bitlen_00[bitlen._4_4_] = 9;
    }
    for (bitlen._4_4_ = 0x100; bitlen._4_4_ < 0x118; bitlen._4_4_ = bitlen._4_4_ + 1) {
      bitlen_00[bitlen._4_4_] = 7;
    }
    for (bitlen._4_4_ = 0x118; bitlen._4_4_ < 0x120; bitlen._4_4_ = bitlen._4_4_ + 1) {
      bitlen_00[bitlen._4_4_] = 8;
    }
    tree_local._4_4_ = HuffmanTree_makeFromLengths(tree,bitlen_00,0x120,0xf);
    lodepng_free(bitlen_00);
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned generateFixedLitLenTree(HuffmanTree* tree) {
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
  if(!bitlen) return 83; /*alloc fail*/

  /*288 possible codes: 0-255=literals, 256=endcode, 257-285=lengthcodes, 286-287=unused*/
  for(i =   0; i <= 143; ++i) bitlen[i] = 8;
  for(i = 144; i <= 255; ++i) bitlen[i] = 9;
  for(i = 256; i <= 279; ++i) bitlen[i] = 7;
  for(i = 280; i <= 287; ++i) bitlen[i] = 8;

  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DEFLATE_CODE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}